

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall
Potassco::AspifOutput::theoryTerm(AspifOutput *this,Id_t termId,int cId,IdSpan *args)

{
  startDir(this,(Directive_t)0x9);
  add(this,2);
  add(this,termId);
  add(this,cId);
  add(this,args);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::theoryTerm(Id_t termId, int cId, const IdSpan& args) {
	startDir(Directive_t::Theory).add(Theory_t::Compound).add(termId).add(cId).add(args).endDir();
}